

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O2

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedTokenWithin
          (DiagnosticsReporter *this,
          vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *validTkKinds)

{
  SyntaxToken *this_00;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_178;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string s;
  string local_98;
  DiagnosticDescriptor local_78;
  
  joinTokenNames_abi_cxx11_(&local_98,(DiagnosticsReporter *)validTkKinds,in_RDX);
  std::operator+(&local_d8,"expected ",&local_98);
  std::operator+(&bStack_178,&local_d8,", got `");
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_f8,this_00);
  std::operator+(&local_78.id_,&bStack_178,&local_f8);
  std::operator+(&s,&local_78.id_,"\'");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&bStack_178);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string(local_118,(string *)&ID_of_ExpectedTokenWithin_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"[[expected one of tokens]]",(allocator<char> *)&bStack_178);
  std::__cxx11::string::string(local_158,(string *)&s);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_78,local_118,local_138,local_158,2,1);
  diagnoseOrDelayDiagnostic(this,&local_78);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_78);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedTokenWithin(const std::vector<SyntaxKind>& validTkKinds)
{
    std::string s = "expected "
            + joinTokenNames(validTkKinds)
            + ", got `"
            + parser_->peek().valueText()
            + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedTokenWithin,
                                     "[[expected one of tokens]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}